

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void mpp_sthd_stop_sync(MppSThd thd)

{
  uint uVar1;
  char *pcVar2;
  void *dummy;
  
  check_sthd("mpp_sthd_stop_sync",(MppSThdImpl *)thd);
  pthread_mutex_lock((pthread_mutex_t *)((long)thd + 0x20));
  uVar1 = *(uint *)((long)thd + 0x10);
  if ((ulong)uVar1 == 4) {
    pthread_join(*(pthread_t *)((long)thd + 0x18),&dummy);
    *(undefined4 *)((long)thd + 0x10) = 1;
  }
  else {
    if ((int)uVar1 < 5) {
      pcVar2 = *(char **)(state2str(MppSThdStatus_e)::strof_sthd_status + (ulong)uVar1 * 8);
    }
    else {
      pcVar2 = "invalid";
    }
    _mpp_log_l(2,"mpp_thread","%s can NOT stop on %s\n",(char *)0x0,*thd,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)thd + 0x20));
  check_sthd("mpp_sthd_stop_sync",(MppSThdImpl *)thd);
  return;
}

Assistant:

void mpp_sthd_stop_sync(MppSThd thd)
{
    MppSThdImpl *impl = (MppSThdImpl *)thd;
    MppSThdStatus status;

    CHECK_STHD(impl);

    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_STOPPING : {
        void *dummy;

        pthread_join(impl->thd, &dummy);
        impl->status = MPP_STHD_READY;
    } break;
    default : {
        mpp_err("%s can NOT stop on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);

    CHECK_STHD(impl);
}